

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.cpp
# Opt level: O0

int CBCDecrypt<AES256Decrypt>(AES256Decrypt *dec,uchar *iv,uchar *data,int size,bool pad,uchar *out)

{
  long lVar1;
  byte bVar2;
  int in_ECX;
  long in_RDX;
  AES256Decrypt *in_RSI;
  byte in_R8B;
  byte *in_R9;
  long in_FS_OFFSET;
  bool bVar3;
  int i_1;
  uchar padsize;
  int i;
  uchar *prev;
  bool fail;
  int written;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int iVar4;
  int local_3c;
  byte *local_38;
  int local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_3c = 0;
  bVar3 = false;
  if (((in_RDX == 0) || (in_ECX == 0)) || (in_R9 == (byte *)0x0)) {
    local_c = 0;
  }
  else {
    local_38 = in_R9;
    if (in_ECX % 0x10 == 0) {
      for (; local_3c != in_ECX; local_3c = local_3c + 0x10) {
        AES256Decrypt::Decrypt
                  (in_RSI,(uchar *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   (uchar *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
        for (iVar4 = 0; iVar4 != 0x10; iVar4 = iVar4 + 1) {
          *local_38 = *local_38 ^ *(byte *)((long)(in_RSI->ctx).rk[0].slice + (long)iVar4);
          local_38 = local_38 + 1;
        }
        in_RSI = (AES256Decrypt *)(in_RDX + local_3c);
        in_stack_ffffffffffffffb4 = 0x10;
      }
      if ((in_R8B & 1) != 0) {
        bVar2 = local_38[-1];
        bVar3 = bVar2 == 0 || 0x10 < bVar2;
        bVar2 = bVar2 * ((bVar3 ^ 0xffU) & 1);
        for (iVar4 = 0x10; local_38 = local_38 + -1, iVar4 != 0; iVar4 = iVar4 + -1) {
          bVar3 = bVar3 || (int)(0x10 - (uint)bVar2) < iVar4 && *local_38 != bVar2;
        }
        local_3c = local_3c - (uint)bVar2;
      }
      local_c = local_3c * (uint)(bVar3 ^ 1);
    }
    else {
      local_c = 0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_c;
}

Assistant:

static int CBCDecrypt(const T& dec, const unsigned char iv[AES_BLOCKSIZE], const unsigned char* data, int size, bool pad, unsigned char* out)
{
    int written = 0;
    bool fail = false;
    const unsigned char* prev = iv;

    if (!data || !size || !out)
        return 0;

    if (size % AES_BLOCKSIZE != 0)
        return 0;

    // Decrypt all data. Padding will be checked in the output.
    while (written != size) {
        dec.Decrypt(out, data + written);
        for (int i = 0; i != AES_BLOCKSIZE; i++)
            *out++ ^= prev[i];
        prev = data + written;
        written += AES_BLOCKSIZE;
    }

    // When decrypting padding, attempt to run in constant-time
    if (pad) {
        // If used, padding size is the value of the last decrypted byte. For
        // it to be valid, It must be between 1 and AES_BLOCKSIZE.
        unsigned char padsize = *--out;
        fail = !padsize | (padsize > AES_BLOCKSIZE);

        // If not well-formed, treat it as though there's no padding.
        padsize *= !fail;

        // All padding must equal the last byte otherwise it's not well-formed
        for (int i = AES_BLOCKSIZE; i != 0; i--)
            fail |= ((i > AES_BLOCKSIZE - padsize) & (*out-- != padsize));

        written -= padsize;
    }
    return written * !fail;
}